

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_bitset_container_intersect(array_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)src_1->cardinality;
  if (0 < (long)uVar3) {
    uVar1 = *src_1->array;
    if ((src_2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        if (uVar3 == uVar4) break;
        uVar1 = src_1->array[uVar4];
        uVar2 = uVar4 + 1;
      } while ((src_2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0);
      return uVar4 < uVar3;
    }
  }
  return 0 < (long)uVar3;
}

Assistant:

bool array_bitset_container_intersect(const array_container_t *src_1,
                                         const bitset_container_t *src_2) {
	const int32_t origcard = src_1->cardinality;
	for (int i = 0; i < origcard; ++i) {
	        uint16_t key = src_1->array[i];
	        if(bitset_container_contains(src_2, key)) return true;
	}
	return false;
}